

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *pIVar1;
  double *pdVar2;
  float fVar3;
  double dVar4;
  short sVar5;
  uint uVar6;
  ImGuiContext *pIVar7;
  ImGuiWindow *pIVar8;
  ImGuiViewportP *pIVar9;
  byte bVar10;
  char cVar11;
  ImVec2 IVar12;
  ImGuiWindow *pIVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  ImGuiWindow *pIVar17;
  ImGuiWindow *pIVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pIVar7 = GImGui;
  pIVar8 = GImGui->MovingWindow;
  if (pIVar8 == (ImGuiWindow *)0x0) {
    pIVar9 = (ImGuiViewportP *)0x0;
    pIVar17 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar9 = pIVar8->Viewport;
    pIVar8->Viewport = GImGui->MouseViewport;
    pIVar17 = (ImGuiWindow *)0x0;
    if ((pIVar8->Flags & 0x200) == 0) {
      pIVar17 = pIVar8;
    }
  }
  pIVar1 = &(pIVar7->Style).TouchExtraPadding;
  IVar12 = *pIVar1;
  if ((pIVar7->IO).ConfigWindowsResizeFromEdges == true) {
    fVar21 = (pIVar7->Style).TouchExtraPadding.x;
    fVar20 = (pIVar7->Style).TouchExtraPadding.y;
    if (fVar21 <= 4.0) {
      fVar21 = 4.0;
    }
    if (fVar20 <= 4.0) {
      fVar20 = 4.0;
    }
    IVar12.y = fVar20;
    IVar12.x = fVar21;
  }
  lVar15 = (long)(pIVar7->Windows).Size;
  if (lVar15 < 1) {
    pIVar13 = (ImGuiWindow *)0x0;
  }
  else {
    lVar15 = lVar15 + 1;
    pIVar13 = (ImGuiWindow *)0x0;
    do {
      pIVar18 = (pIVar7->Windows).Data[lVar15 + -2];
      bVar19 = false;
      if (((pIVar18->Active == true) && (pIVar18->Hidden == false)) &&
         (uVar6 = pIVar18->Flags, (uVar6 >> 9 & 1) == 0)) {
        if (pIVar18->Viewport == (ImGuiViewportP *)0x0) {
          __assert_fail("window->Viewport",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x1256,"void FindHoveredWindow()");
        }
        if (pIVar18->Viewport == pIVar7->MouseViewport) {
          fVar21 = pIVar1->x;
          if ((uVar6 & 0x1000042) == 0) {
            fVar21 = IVar12.x;
          }
          fVar20 = (pIVar7->IO).MousePos.x;
          if ((pIVar18->OuterRectClipped).Min.x - fVar21 <= fVar20) {
            fVar22 = (pIVar7->Style).TouchExtraPadding.y;
            if ((uVar6 & 0x1000042) == 0) {
              fVar22 = IVar12.y;
            }
            fVar3 = (pIVar7->IO).MousePos.y;
            if ((((pIVar18->OuterRectClipped).Min.y - fVar22 <= fVar3) &&
                (fVar20 < fVar21 + (pIVar18->OuterRectClipped).Max.x)) &&
               (fVar3 < fVar22 + (pIVar18->OuterRectClipped).Max.y)) {
              sVar5 = (pIVar18->HitTestHoleSize).x;
              if (sVar5 != 0) {
                fVar21 = (float)(int)(pIVar18->HitTestHoleOffset).x + (pIVar18->Pos).x;
                if (fVar21 <= fVar20) {
                  fVar22 = (float)(int)(pIVar18->HitTestHoleOffset).y + (pIVar18->Pos).y;
                  bVar19 = (fVar3 < (float)(int)(pIVar18->HitTestHoleSize).y + fVar22 &&
                           fVar20 < fVar21 + (float)(int)sVar5) && fVar22 <= fVar3;
                }
                else {
                  bVar19 = false;
                }
                if (bVar19) {
                  bVar19 = false;
                  goto LAB_00124bc2;
                }
              }
              if (pIVar17 == (ImGuiWindow *)0x0) {
                pIVar17 = pIVar18;
              }
              if (((pIVar13 == (ImGuiWindow *)0x0) &&
                  (pIVar13 = pIVar18, pIVar8 != (ImGuiWindow *)0x0)) &&
                 (pIVar18->RootWindow == pIVar8->RootWindow)) {
                pIVar13 = (ImGuiWindow *)0x0;
              }
              bVar19 = pIVar13 != (ImGuiWindow *)0x0 && pIVar17 != (ImGuiWindow *)0x0;
            }
          }
        }
      }
LAB_00124bc2:
    } while ((!bVar19) && (lVar15 = lVar15 + -1, 1 < lVar15));
  }
  pIVar7->HoveredWindow = pIVar17;
  if (pIVar17 == (ImGuiWindow *)0x0) {
    pIVar18 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar18 = pIVar17->RootWindow;
  }
  pIVar7->HoveredRootWindow = pIVar18;
  pIVar7->HoveredWindowUnderMovingWindow = pIVar13;
  if (pIVar8 != (ImGuiWindow *)0x0) {
    pIVar8->Viewport = pIVar9;
  }
  if ((pIVar17 != pIVar8 && pIVar17 != (ImGuiWindow *)0x0) &&
     (pIVar17->Viewport != pIVar7->MouseViewport)) {
    __assert_fail("g.HoveredWindow == __null || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0xf16,"void ImGui::UpdateHoveredWindowAndCaptureFlags()");
  }
  pIVar8 = GetTopMostPopupModal();
  bVar19 = false;
  if ((pIVar8 != (ImGuiWindow *)0x0) && (bVar19 = false, pIVar18 != (ImGuiWindow *)0x0)) {
    if (pIVar18->RootWindow == pIVar8) {
      bVar19 = false;
    }
    else {
      do {
        bVar19 = pIVar18 == pIVar8;
        if (bVar19) goto LAB_00124c5b;
        pIVar18 = pIVar18->ParentWindow;
      } while (pIVar18 != (ImGuiWindow *)0x0);
      bVar19 = false;
LAB_00124c5b:
      bVar19 = (bool)(bVar19 ^ 1);
    }
  }
  uVar6 = (pIVar7->IO).ConfigFlags;
  iVar14 = -1;
  lVar15 = 0;
  bVar10 = 0;
  do {
    if ((pIVar7->IO).MouseClicked[lVar15] == true) {
      bVar16 = true;
      if (pIVar17 == (ImGuiWindow *)0x0) {
        bVar16 = 0 < (pIVar7->OpenPopupStack).Size;
      }
      (pIVar7->IO).MouseDownOwned[lVar15] = bVar16;
    }
    bVar16 = (pIVar7->IO).MouseDown[lVar15];
    if ((bVar16 == true) &&
       ((iVar14 == -1 ||
        (dVar4 = (pIVar7->IO).MouseClickedTime[iVar14],
        pdVar2 = (pIVar7->IO).MouseClickedTime + lVar15, *pdVar2 <= dVar4 && dVar4 != *pdVar2)))) {
      iVar14 = (int)lVar15;
    }
    bVar10 = bVar10 & 1 | bVar16;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 5);
  bVar16 = true;
  if ((uVar6 & 0x10) == 0) {
    bVar16 = bVar19;
  }
  cVar11 = '\x01';
  if (iVar14 != -1) {
    cVar11 = (pIVar7->IO).MouseDownOwned[iVar14];
  }
  bVar19 = true;
  if ((pIVar7->DragDropActive == true) && (bVar19 = true, (pIVar7->DragDropSourceFlags & 0x10) != 0)
     ) {
    bVar19 = bVar16;
  }
  if (cVar11 != '\0') {
    bVar19 = bVar16;
  }
  if (bVar19) {
    pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar7->WantCaptureMouseNextFrame == -1) {
    if ((cVar11 == '\0') ||
       ((bVar19 = true, pIVar7->HoveredWindow == (ImGuiWindow *)0x0 && (bVar10 == 0)))) {
      bVar19 = 0 < (pIVar7->OpenPopupStack).Size;
    }
    (pIVar7->IO).WantCaptureMouse = bVar19;
  }
  else {
    (pIVar7->IO).WantCaptureMouse = pIVar7->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar7->WantCaptureKeyboardNextFrame == -1) {
    bVar19 = pIVar7->ActiveId != 0 || pIVar8 != (ImGuiWindow *)0x0;
  }
  else {
    bVar19 = pIVar7->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar7->IO).WantCaptureKeyboard = bVar19;
  if (((uVar6 & 9) == 1 & (pIVar7->IO).NavActive) == 1) {
    (pIVar7->IO).WantCaptureKeyboard = true;
  }
  (pIVar7->IO).WantTextInput = pIVar7->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}